

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O2

Task * AI::create_MoveToPlayer(void)

{
  Task *in_RDI;
  RequiredValue local_3c;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"moveToPlayer",(allocator<char> *)&local_3c);
  Task::Task(in_RDI,&local_30,Simple);
  std::__cxx11::string::~string((string *)&local_30);
  in_RDI->action = MoveToPlayer;
  local_3c.id = Alertness;
  local_3c.op = GreaterEqual;
  local_3c.value = 80.0;
  std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>::
  emplace_back<AI::RequiredValue>(&(in_RDI->preconditions).requiredValues,&local_3c);
  local_3c._0_5_ = 0x100000003;
  std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::emplace_back<AI::RequiredFlag>
            ((vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *)in_RDI,
             (RequiredFlag *)&local_3c);
  local_3c.id = Alertness;
  local_3c.op = ~LessThan;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  emplace_back<AI::SatisfiablePredicateParams>
            (&(in_RDI->postconditions).satisfiedPredicates,(SatisfiablePredicateParams *)&local_3c);
  return in_RDI;
}

Assistant:

Task create_MoveToPlayer()
	{
		Task move {"moveToPlayer"};
		move.action = Action::MoveToPlayer;
		move.preconditions.requiredValues.push_back({WorldStateIdentifier::Alertness, ConditionOp::GreaterEqual, 80.f});
		move.preconditions.requiredFlags.push_back({WorldStateIdentifier::PlayerIdentified, true});
		
		move.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::NearPlayer, -1});

		return move;
	}